

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDuplicateRuleInDifferentSubninjas::Run(ParserTestDuplicateRuleInDifferentSubninjas *this)

{
  Test *this_00;
  bool condition;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string err;
  undefined1 local_d0 [8];
  ManifestParser parser;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ParserTestDuplicateRuleInDifferentSubninjas *local_10;
  ParserTestDuplicateRuleInDifferentSubninjas *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test.ninja",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"rule cat\n  command = cat\n",(allocator<char> *)&parser.field_0x5f
            );
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&parser.field_0x5f);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_d0,&(this->super_ParserTest).state,
             (FileReader *)&(this->super_ParserTest).fs_,(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_f8);
  this_00 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"rule cat\n  command = cat\nsubninja test.ninja\n",&local_119);
  condition = ManifestParser::ParseTest((ManifestParser *)local_d0,&local_118,(string *)local_f8);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x390,
             "parser.ParseTest(\"rule cat\\n\" \"  command = cat\\n\" \"subninja test.ninja\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)local_f8);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjas) {
  // Test that rules are scoped to subninjas.
  fs_.Create("test.ninja", "rule cat\n"
                         "  command = cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cat\n"
                                "  command = cat\n"
                                "subninja test.ninja\n", &err));
}